

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::Tracer_testPropagation_Test::TestBody(Tracer_testPropagation_Test *this)

{
  byte bVar1;
  uchar flags;
  uint64_t uVar2;
  uint64_t uVar3;
  element_type *peVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined8 uVar7;
  value_type *pvVar8;
  SpanContext *pSVar9;
  SpanContext *pSVar10;
  mapped_type *pmVar11;
  long lVar12;
  long lVar13;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  __it;
  char cVar14;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  *psVar15;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar16;
  __buckets_ptr pp_Var17;
  char *pcVar18;
  pointer __old_p;
  SpanContext SVar19;
  pointer __old_p_3;
  ReaderMock<opentracing::v3::TextMapReader> textReader;
  AssertHelper local_4f8 [8];
  FakeSpanContext fakeCtx;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8 [6];
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__1;
  undefined1 local_490 [32];
  undefined8 uStack_470;
  shared_ptr<jaegertracing::Tracer> tracer;
  allocator local_453;
  undefined1 local_452;
  undefined1 local_451;
  WriterMock<opentracing::v3::HTTPHeadersWriter> headerWriter;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_410;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  ReaderMock<opentracing::v3::HTTPHeadersReader> headerReader;
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result;
  char *local_2b8;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  stringstream ss;
  undefined1 auStack_290 [16];
  pointer ppStack_280;
  pointer local_278;
  pointer ppStack_270;
  pointer local_268;
  pointer ppStack_260;
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  SpanContext local_e0;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)&tracer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &((storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                *)auStack_290)->m_value);
  local_268 = (pointer)0x0;
  ppStack_260 = (pointer)0x0;
  local_278 = (pointer)0x0;
  ppStack_270 = (pointer)0x0;
  auStack_290._8_8_ = (error_category *)0x0;
  ppStack_280 = (pointer)0x0;
  _ss = (duration)0;
  auStack_290._0_8_ =
       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
        )0x0;
  (**(code **)(*(long *)tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x10))
            (&gtest_ar,
             tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "test-inject",0xb,(StartSpanOptions *)&ss);
  uVar5 = gtest_ar._0_8_;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  opentracing::v3::StartSpanOptions::~StartSpanOptions((StartSpanOptions *)&ss);
  (**(code **)(*(long *)uVar5 + 0x28))
            (uVar5,"test-baggage-item-key",0x15,"test baggage item value",0x17);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  peVar4 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar7 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
  (**(code **)(*(long *)peVar4 + 0x18))
            (&gtest_ar,peVar4,uVar7,
             &(((storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                 *)auStack_290)->m_error)._M_cat);
  result.has_value_ = gtest_ar.success_;
  result.contained.m_value._M_t.
  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
       (value_type)
       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
        )0x0;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&result.has_value_,"static_cast<bool>(tracer->Inject(span->context(), ss))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fakeCtx,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x15c,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fakeCtx,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&result.contained.m_value);
LAB_001a8698:
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&result.contained.m_value);
    (**(code **)(*(long *)tracer.
                          super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 0x38))
              (&result,tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&ss);
    gtest_ar__1.success_ = result.has_value_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (result.has_value_ == false) {
      testing::Message::Message((Message *)&fakeCtx);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&gtest_ar,&gtest_ar__1.success_,"static_cast<bool>(result)","false");
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&textReader,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x15e,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&textReader,(Message *)&fakeCtx);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&fakeCtx);
LAB_001a8686:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__1.message_);
LAB_001a868b:
      opentracing::v3::
      expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
      ::~expected(&result);
      goto LAB_001a8698;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    pvVar8 = opentracing::v3::
             expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
             ::operator->(&result);
    pSVar10 = (SpanContext *)
              (pvVar8->_M_t).
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl;
    (pvVar8->_M_t).
    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl = (SpanContext *)0x0;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__1.success_ = pSVar10 != (SpanContext *)0x0;
    if (pSVar10 == (SpanContext *)0x0) {
      testing::Message::Message((Message *)&fakeCtx);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&gtest_ar,&gtest_ar__1.success_,"static_cast<bool>(extractedCtx)","false");
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&textReader,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x161,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&textReader,(Message *)&fakeCtx);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&fakeCtx);
      goto LAB_001a8686;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar5 + 0x50))(uVar5);
    testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
              ((internal *)&gtest_ar,"span->context()","*extractedCtx",pSVar9,pSVar10);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fakeCtx,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x162,pcVar18);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fakeCtx,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      (*(pSVar10->super_SpanContext)._vptr_SpanContext[1])(pSVar10);
      goto LAB_001a868b;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)&PTR__SpanContext_0021edd0;
    std::ios::clear((int)&ss + (int)*(undefined8 *)((long)_ss + -0x18));
    SVar19._vptr_SpanContext = (_func_int **)0x1f210c;
    std::__cxx11::string::string((string *)&gtest_ar,"",(allocator *)&gtest_ar__1);
    std::__cxx11::stringbuf::str((string *)&ppStack_280);
    std::__cxx11::string::~string((string *)&gtest_ar);
    (**(code **)(*(long *)tracer.
                          super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 0x18))
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
               tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &fakeCtx,&(((storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                            *)auStack_290)->m_error)._M_cat);
    bVar6 = gtest_ar.success_;
    gtest_ar__1._0_8_ = CONCAT71(gtest_ar__1._1_7_,gtest_ar.success_) ^ 1;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar.success_ != false) {
      testing::Message::Message((Message *)&textReader);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&gtest_ar,&gtest_ar__1.success_,"static_cast<bool>(tracer->Inject(fakeCtx, ss))",
                 "true");
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x166,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__5,(Message *)&textReader);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&textReader);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    (*(pSVar10->super_SpanContext)._vptr_SpanContext[1])(pSVar10);
    opentracing::v3::
    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
    ::~expected(&result);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    peVar4 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar6 == false) {
      gtest_ar._0_8_ = &aStack_410;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      aStack_410._M_allocated_capacity = 0;
      fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)&PTR__TextMapWriter_0021eeb0;
      local_4e8[0].ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
      uVar7 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
      (**(code **)(*(long *)peVar4 + 0x20))(&ss,peVar4,uVar7,&fakeCtx);
      psVar15 = &result.contained;
      result.has_value_ = (bool)ss;
      result.contained.m_value._M_t.
      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
           (value_type)
           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
            )0x0;
      if (ss == (stringstream)0x0) {
        testing::Message::Message((Message *)&gtest_ar__1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&ss,&result.has_value_,
                   "static_cast<bool>(tracer->Inject(span->context(), textWriter))","false");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&textReader,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                   ,0x16e,(char *)_ss);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&textReader,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
        std::__cxx11::string::~string((string *)&ss);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__1);
LAB_001a8869:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&psVar15->m_value);
LAB_001a89f7:
        this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&gtest_ar;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&psVar15->m_value);
        gtest_ar__1._0_4_ = 2;
        result.has_value_ = false;
        result._1_7_ = 0;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&ss,"2","textMap.size()",(int *)&gtest_ar__1,(unsigned_long *)&result
                  );
        if (ss == (stringstream)0x0) {
          testing::Message::Message((Message *)&result);
          if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
               )auStack_290._0_8_ !=
              (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
               )0x0) {
            SVar19._vptr_SpanContext = *(_func_int ***)auStack_290._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x16f,(char *)SVar19._vptr_SpanContext);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1,(Message *)&result);
          psVar15 = (storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                     *)auStack_290;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&result);
          goto LAB_001a8869;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&((storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                            *)auStack_290)->m_value);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        pSVar10 = (SpanContext *)(**(code **)(*(long *)uVar5 + 0x50))(uVar5);
        SpanContext::print<std::ostream>
                  (pSVar10,(basic_ostream<char,_std::char_traits<char>_> *)&ss);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string
                  ((string *)&gtest_ar__1,"uber-trace-id",(allocator *)&gtest_ar__5);
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&gtest_ar,(key_type *)&gtest_ar__1);
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)&textReader,"oss.str()","textMap.at(kTraceContextHeaderName)",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   pmVar11);
        std::__cxx11::string::~string((string *)&gtest_ar__1);
        std::__cxx11::string::~string((string *)&result);
        if ((char)textReader.super_TextMapReader._vptr_TextMapReader == '\0') {
          testing::Message::Message((Message *)&result);
          if (textReader._keyValuePairs == (StrMap *)0x0) {
            pp_Var17 = (__buckets_ptr)0x1f210c;
          }
          else {
            pp_Var17 = ((textReader._keyValuePairs)->_M_h)._M_buckets;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x172,(char *)pp_Var17);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1,(Message *)&result);
LAB_001a89c3:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&result);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&textReader._keyValuePairs);
LAB_001a89ea:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
          goto LAB_001a89f7;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&textReader._keyValuePairs);
        std::__cxx11::string::string((string *)&gtest_ar__1,"uberctx-",(allocator *)&gtest_ar__5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar__1,"test-baggage-item-key");
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&gtest_ar,(key_type *)&result);
        testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
                  ((internal *)&textReader,"\"test baggage item value\"",
                   "textMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")",
                   (char (*) [24])"test baggage item value",pmVar11);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&gtest_ar__1);
        if ((char)textReader.super_TextMapReader._vptr_TextMapReader == '\0') {
          testing::Message::Message((Message *)&result);
          if (textReader._keyValuePairs == (StrMap *)0x0) {
            pp_Var17 = (__buckets_ptr)0x1f210c;
          }
          else {
            pp_Var17 = ((textReader._keyValuePairs)->_M_h)._M_buckets;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x175,(char *)pp_Var17);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1,(Message *)&result);
          goto LAB_001a89c3;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&textReader._keyValuePairs);
        textReader.super_TextMapReader._vptr_TextMapReader =
             (_func_int **)&PTR__TextMapReader_0021eef0;
        textReader._keyValuePairs = (StrMap *)&gtest_ar;
        (**(code **)(*(long *)tracer.
                              super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x40))
                  (&gtest_ar__1,
                   tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&textReader);
        gtest_ar__5.success_ = gtest_ar__1.success_;
        gtest_ar__5.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (gtest_ar__1.success_ == false) {
          testing::Message::Message((Message *)&headerWriter);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&result,&gtest_ar__5.success_,"static_cast<bool>(result)",
                     "false");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&headerReader,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x178,(char *)result._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&headerReader,(Message *)&headerWriter);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&headerReader);
          std::__cxx11::string::~string((string *)&result);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&headerWriter);
LAB_001a8aa0:
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__5.message_);
          opentracing::v3::
          expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
          ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                       *)&gtest_ar__1);
          goto LAB_001a89ea;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__5.message_);
        pvVar8 = opentracing::v3::
                 expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                 ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               *)&gtest_ar__1);
        pSVar10 = (SpanContext *)
                  (pvVar8->_M_t).
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl;
        (pvVar8->_M_t).
        super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
        ._M_t.
        super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
        .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
             (SpanContext *)0x0;
        gtest_ar__5.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar__5.success_ = pSVar10 != (SpanContext *)0x0;
        if (pSVar10 == (SpanContext *)0x0) {
          testing::Message::Message((Message *)&headerWriter);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&result,&gtest_ar__5.success_,
                     "static_cast<bool>(extractedCtx)","false");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&headerReader,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x17b,(char *)result._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&headerReader,(Message *)&headerWriter);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&headerReader);
          std::__cxx11::string::~string((string *)&result);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&headerWriter);
          goto LAB_001a8aa0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__5.message_);
        pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar5 + 0x50))(uVar5);
        testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                  ((internal *)&result,"span->context()","*extractedCtx",pSVar9,pSVar10);
        bVar6 = result.has_value_;
        if (result.has_value_ == false) {
          testing::Message::Message((Message *)&gtest_ar__5);
          if (result.contained.m_value._M_t.
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl ==
              (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
               )0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)result.contained.m_value._M_t.
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&headerWriter,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x17c,pcVar18);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&headerWriter,(Message *)&gtest_ar__5);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&headerWriter);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__5);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&result.contained.m_value);
        (*(pSVar10->super_SpanContext)._vptr_SpanContext[1])(pSVar10);
        opentracing::v3::
        expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
        ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                     *)&gtest_ar__1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&gtest_ar);
        peVar4 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (bVar6 == false) goto LAB_001a86a5;
        gtest_ar__1._0_8_ = &uStack_470;
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        local_490._0_8_ = 0;
        local_490._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_490._16_4_ = 1.0;
        local_490._24_8_ = 0;
        uStack_470 = (__node_base_ptr)0x0;
        headerWriter.super_HTTPHeadersWriter.super_TextMapWriter._vptr_TextMapWriter =
             (TextMapWriter)&PTR__TextMapWriter_0021ee28;
        headerWriter._keyValuePairs = (StrMap *)&gtest_ar__1;
        uVar7 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
        (**(code **)(*(long *)peVar4 + 0x28))(&ss,peVar4,uVar7,&headerWriter);
        psVar15 = (storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                   *)&gtest_ar.message_;
        gtest_ar.success_ = (bool)ss;
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (ss == (stringstream)0x0) {
          testing::Message::Message((Message *)&result);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&ss,&gtest_ar.success_,
                     "static_cast<bool>(tracer->Inject(span->context(), headerWriter))","false");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&fakeCtx,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x184,(char *)_ss);
          testing::internal::AssertHelper::operator=((AssertHelper *)&fakeCtx,(Message *)&result);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
          std::__cxx11::string::~string((string *)&ss);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&result);
LAB_001a95d3:
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&psVar15->m_value);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&psVar15->m_value);
          result._0_4_ = 2;
          gtest_ar._0_8_ = local_490._8_8_;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&ss,"2","headerMap.size()",(int *)&result,
                     (unsigned_long *)&gtest_ar);
          if (ss == (stringstream)0x0) {
            testing::Message::Message((Message *)&gtest_ar);
            if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                 )auStack_290._0_8_ ==
                (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                 )0x0) {
              SVar19._vptr_SpanContext = (_func_int **)0x1f210c;
            }
            else {
              SVar19._vptr_SpanContext = *(_func_int ***)auStack_290._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&result,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                       ,0x185,(char *)SVar19._vptr_SpanContext);
            testing::internal::AssertHelper::operator=((AssertHelper *)&result,(Message *)&gtest_ar)
            ;
            psVar15 = (storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                       *)auStack_290;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            goto LAB_001a95d3;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&((storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              *)auStack_290)->m_value);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          pSVar10 = (SpanContext *)(**(code **)(*(long *)uVar5 + 0x50))(uVar5);
          SpanContext::print<std::ostream>
                    (pSVar10,(basic_ostream<char,_std::char_traits<char>_> *)&ss);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string((string *)&result,"uber-trace-id",(allocator *)&textReader);
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&gtest_ar__1,(key_type *)&result);
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&fakeCtx,"oss.str()","headerMap.at(kTraceContextHeaderName)",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                     pmVar11);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((char)fakeCtx.super_SpanContext._vptr_SpanContext == '\0') {
            testing::Message::Message((Message *)&gtest_ar);
            if (local_4e8[0].ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar18 = "";
            }
            else {
              pcVar18 = ((local_4e8[0].ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&result,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                       ,0x188,pcVar18);
            testing::internal::AssertHelper::operator=((AssertHelper *)&result,(Message *)&gtest_ar)
            ;
LAB_001a96de:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(local_4e8);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(local_4e8);
            std::__cxx11::string::string((string *)&result,"uberctx-",(allocator *)&textReader);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &result,"test-baggage-item-key");
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&gtest_ar__1,(key_type *)&gtest_ar);
            testing::internal::CmpHelperEQ<char[30],std::__cxx11::string>
                      ((internal *)&fakeCtx,"\"test%20baggage%20item%20value\"",
                       "headerMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                       ,(char (*) [30])"test%20baggage%20item%20value",pmVar11);
            std::__cxx11::string::~string((string *)&gtest_ar);
            std::__cxx11::string::~string((string *)&result);
            if ((char)fakeCtx.super_SpanContext._vptr_SpanContext == '\0') {
              testing::Message::Message((Message *)&gtest_ar);
              if (local_4e8[0].ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar18 = "";
              }
              else {
                pcVar18 = ((local_4e8[0].ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&result,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x18b,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&result,(Message *)&gtest_ar);
              goto LAB_001a96de;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(local_4e8);
            headerReader.super_HTTPHeadersReader.super_TextMapReader._vptr_TextMapReader =
                 (TextMapReader)&PTR__TextMapReader_0021ee68;
            headerReader._keyValuePairs = (StrMap *)&gtest_ar__1;
            (**(code **)(*(long *)tracer.
                                  super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x48))(&gtest_ar__5);
            result.has_value_ = gtest_ar__5.success_;
            result.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                 (value_type)
                 (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                  )0x0;
            if (gtest_ar__5.success_ == false) {
              testing::Message::Message((Message *)&fakeCtx);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&gtest_ar,&result.has_value_,"static_cast<bool>(result)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&textReader,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x18e,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&textReader,(Message *)&fakeCtx);
LAB_001a9783:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
              std::__cxx11::string::~string((string *)&gtest_ar);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&fakeCtx);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&result.contained.m_value);
              pvVar8 = opentracing::v3::
                       expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                       ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                     *)&gtest_ar__5);
              __old_p_3 = (pointer)(pvVar8->_M_t).
                                   super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                   _M_head_impl;
              (pvVar8->_M_t).
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                   (SpanContext *)0x0;
              result.contained.m_value._M_t.
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                   (value_type)
                   (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                    )0x0;
              result.has_value_ = __old_p_3 != (SpanContext *)0x0;
              if (__old_p_3 == (SpanContext *)0x0) {
                testing::Message::Message((Message *)&fakeCtx);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&gtest_ar,&result.has_value_,"static_cast<bool>(extractedCtx)","false");
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&textReader,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x191,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                goto LAB_001a9783;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&result.contained.m_value);
              pSVar10 = (SpanContext *)(**(code **)(*(long *)uVar5 + 0x50))(uVar5);
              testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                        ((internal *)&gtest_ar,"span->context()","*extractedCtx",pSVar10,__old_p_3);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&result);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar18 = "";
                }
                else {
                  pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&fakeCtx,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x192,pcVar18);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&fakeCtx,(Message *)&result);
                psVar15 = (storage_t<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                           *)&gtest_ar.message_;
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&result);
LAB_001a98bf:
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&psVar15->m_value);
                cVar14 = '\0';
LAB_001a98c6:
                (*(__old_p_3->super_SpanContext)._vptr_SpanContext[1])(__old_p_3);
LAB_001a98d0:
                opentracing::v3::
                expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                             *)&gtest_ar__5);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&gtest_ar__1);
                if (cVar14 != '\0') {
                  (**(code **)(*(long *)tracer.
                                        super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x58))();
                }
                if (uVar5 == 0) goto LAB_001a86ae;
                goto LAB_001a86a5;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&gtest_ar__1);
              std::__cxx11::string::string
                        ((string *)&gtest_ar,"jaeger-debug-id",(allocator *)&result);
              pmVar11 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&gtest_ar__1,(key_type *)&gtest_ar);
              std::__cxx11::string::assign((char *)pmVar11);
              std::__cxx11::string::~string((string *)&gtest_ar);
              peVar4 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              uVar7 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
              (**(code **)(*(long *)peVar4 + 0x28))(local_f8,peVar4,uVar7,&headerWriter);
              (**(code **)(*(long *)tracer.
                                    super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x48))
                        (&gtest_ar,
                         tracer.
                         super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,&headerReader);
              opentracing::v3::
              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
              ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                           *)&gtest_ar__5,
                          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                           *)&gtest_ar);
              opentracing::v3::
              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
              ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                           *)&gtest_ar);
              psVar15 = &result.contained;
              result.has_value_ = gtest_ar__5.success_;
              result.contained.m_value._M_t.
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                   (value_type)
                   (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                    )0x0;
              if (gtest_ar__5.success_ == false) {
                testing::Message::Message((Message *)&fakeCtx);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&gtest_ar,&result.has_value_,"static_cast<bool>(result)","false");
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&textReader,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x199,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                std::__cxx11::string::~string((string *)&gtest_ar);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&fakeCtx);
                goto LAB_001a98bf;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&psVar15->m_value);
              pvVar8 = opentracing::v3::
                       expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                       ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                     *)&gtest_ar__5);
              pSVar10 = (SpanContext *)
                        (pvVar8->_M_t).
                        super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                        .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl;
              (pvVar8->_M_t).
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                   (SpanContext *)0x0;
              (*(__old_p_3->super_SpanContext)._vptr_SpanContext[1])(__old_p_3);
              result.contained.m_value._M_t.
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                   (value_type)
                   (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                    )0x0;
              result.has_value_ = pSVar10 != (SpanContext *)0x0;
              if (pSVar10 != (SpanContext *)0x0) {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&result.contained.m_value);
                pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                testing::internal::
                CmpHelperNE<jaegertracing::SpanContext,jaegertracing::SpanContext>
                          ((internal *)&gtest_ar,"span->context()","*extractedCtx",pSVar9,pSVar10);
                __old_p_3 = pSVar10;
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&result);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar18 = "";
                  }
                  else {
                    pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&fakeCtx,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                             ,0x19c,pcVar18);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&fakeCtx,(Message *)&result);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&result);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  cVar14 = '\0';
                  goto LAB_001a98c6;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                lVar12 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                uVar2 = *(uint64_t *)(lVar13 + 0x18);
                lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                uVar3 = *(uint64_t *)(lVar13 + 0x20);
                lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                bVar1 = *(byte *)(lVar13 + 0x28);
                lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                std::__cxx11::string::string((string *)&gtest_ar,"yes",(allocator *)&fakeCtx);
                SpanContext::SpanContext
                          ((SpanContext *)&result,(TraceID *)(lVar12 + 8),uVar2,uVar3,bVar1 | 2,
                           (StrMap *)(lVar13 + 0x30),(string *)&gtest_ar);
                std::__cxx11::string::~string((string *)&gtest_ar);
                testing::internal::
                CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                          ((internal *)&gtest_ar,"ctx","*extractedCtx",(SpanContext *)&result,
                           pSVar10);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&fakeCtx);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar18 = "";
                  }
                  else {
                    pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&textReader,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                             ,0x1a5,pcVar18);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&textReader,(Message *)&fakeCtx);
LAB_001a9aff:
                  psVar16 = &gtest_ar.message_;
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&fakeCtx);
LAB_001a9b1e:
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(psVar16);
                  cVar14 = '\0';
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&gtest_ar__1);
                  std::__cxx11::string::string
                            ((string *)&gtest_ar,"uber-trace-id",(allocator *)&fakeCtx);
                  pmVar11 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&gtest_ar__1,(key_type *)&gtest_ar);
                  std::__cxx11::string::assign((char *)pmVar11);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  (**(code **)(*(long *)tracer.
                                        super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x48))
                            (&gtest_ar,
                             tracer.
                             super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&headerReader);
                  opentracing::v3::
                  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                  ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               *)&gtest_ar__5,
                              (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               *)&gtest_ar);
                  opentracing::v3::
                  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                  ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               *)&gtest_ar);
                  fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ = gtest_ar__5.success_;
                  local_4e8[0].ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  if (gtest_ar__5.success_ == false) {
                    testing::Message::Message((Message *)&textReader);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&gtest_ar,(char *)&fakeCtx,"static_cast<bool>(result)","false");
                    testing::internal::AssertHelper::AssertHelper
                              (local_4f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                               ,0x1ab,(char *)gtest_ar._0_8_);
                    testing::internal::AssertHelper::operator=(local_4f8,(Message *)&textReader);
LAB_001a9aaa:
                    psVar16 = local_4e8;
                    testing::internal::AssertHelper::~AssertHelper(local_4f8);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&textReader);
                    goto LAB_001a9b1e;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(local_4e8);
                  pvVar8 = opentracing::v3::
                           expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                           ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                         *)&gtest_ar__5);
                  __old_p_3 = (pointer)(pvVar8->_M_t).
                                       super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                       .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                       ._M_head_impl;
                  (pvVar8->_M_t).
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                       (SpanContext *)0x0;
                  (*(pSVar10->super_SpanContext)._vptr_SpanContext[1])();
                  testing::internal::EqHelper<true>::Compare<jaegertracing::SpanContext_const>
                            ((EqHelper<true> *)&gtest_ar,"nullptr","extractedCtx.get()",
                             (Secret *)0x0,__old_p_3);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&fakeCtx);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar18 = "";
                    }
                    else {
                      pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&textReader,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                               ,0x1ad,pcVar18);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&textReader,(Message *)&fakeCtx);
LAB_001a9c1e:
                    psVar16 = &gtest_ar.message_;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&fakeCtx);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&gtest_ar__1);
                    (**(code **)(*(long *)tracer.
                                          super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x48))
                              (&gtest_ar,
                               tracer.
                               super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&headerReader);
                    opentracing::v3::
                    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                    ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                 *)&gtest_ar__5,
                                (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                 *)&gtest_ar);
                    opentracing::v3::
                    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                    ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                 *)&gtest_ar);
                    psVar16 = local_4e8;
                    fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ = gtest_ar__5.success_;
                    local_4e8[0].ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    if (gtest_ar__5.success_ != false) {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(psVar16);
                      pvVar8 = opentracing::v3::
                               expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                             *)&gtest_ar__5);
                      pSVar10 = (SpanContext *)
                                (pvVar8->_M_t).
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl;
                      (pvVar8->_M_t).
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                           (SpanContext *)0x0;
                      if (__old_p_3 != (SpanContext *)0x0) {
                        (*(__old_p_3->super_SpanContext)._vptr_SpanContext[1])(__old_p_3);
                      }
                      testing::internal::EqHelper<true>::Compare<jaegertracing::SpanContext_const>
                                ((EqHelper<true> *)&gtest_ar,"nullptr","extractedCtx.get()",
                                 (Secret *)0x0,pSVar10);
                      __old_p_3 = pSVar10;
                      if (gtest_ar.success_ != false) {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&gtest_ar__1);
                        lVar12 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                        lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                        uVar2 = *(uint64_t *)(lVar13 + 0x18);
                        lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                        uVar3 = *(uint64_t *)(lVar13 + 0x20);
                        lVar13 = (**(code **)(*(long *)uVar5 + 0x50))(uVar5);
                        flags = *(uchar *)(lVar13 + 0x28);
                        std::
                        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar,(char (*) [2])0x1eab21,(char (*) [2])0x1e498c);
                        std::
                        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                  (&local_400,(char (*) [2])0x1edfa8,(char (*) [2])0x1ef5a3);
                        std::
                        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                  (&local_3c0,(char (*) [2])0x1e7d20,(char (*) [2])0x1e62cf);
                        std::
                        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        ::
                        _Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                    *)&fakeCtx,&gtest_ar,&headerReader,0,local_4f8,&local_451,
                                   &local_452);
                        local_2b8 = "";
                        std::__cxx11::string::string((string *)&textReader,"",&local_453);
                        SpanContext::SpanContext
                                  (&local_e0,(TraceID *)(lVar12 + 8),uVar2,uVar3,flags,
                                   (StrMap *)&fakeCtx,(string *)&textReader);
                        __it._M_cur = (__node_type *)local_490;
                        SpanContext::swap((SpanContext *)&result,&local_e0);
                        SpanContext::~SpanContext(&local_e0);
                        std::__cxx11::string::~string((string *)&textReader);
                        std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                       *)&fakeCtx);
                        lVar12 = 0x80;
                        do {
                          std::
                          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(&gtest_ar.success_ + lVar12));
                          lVar12 = lVar12 + -0x40;
                        } while (lVar12 != -0x40);
                        (**(code **)(*(long *)tracer.
                                              super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + 0x28))
                                  (local_110,
                                   tracer.
                                   super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,&result,&headerWriter);
                        do {
                          __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt
                          ;
                          while( true ) {
                            if (__it._M_cur == (__node_type *)0x0) {
                              std::__cxx11::string::string
                                        ((string *)&gtest_ar,"jaeger-baggage",(allocator *)&fakeCtx)
                              ;
                              pmVar11 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&gtest_ar__1,(key_type *)&gtest_ar);
                              std::__cxx11::string::assign((char *)pmVar11);
                              std::__cxx11::string::~string((string *)&gtest_ar);
                              (**(code **)(*(long *)tracer.
                                                  super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + 0x48))
                                        (&gtest_ar,
                                         tracer.
                                         super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,&headerReader);
                              opentracing::v3::
                              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                           *)&gtest_ar__5,
                                          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                           *)&gtest_ar);
                              opentracing::v3::
                              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                           *)&gtest_ar);
                              fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ =
                                   gtest_ar__5.success_;
                              local_4e8[0].ptr_ =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                              if (gtest_ar__5.success_ == false) {
                                testing::Message::Message((Message *)&textReader);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&gtest_ar,(char *)&fakeCtx,"static_cast<bool>(result)",
                                           "false");
                                testing::internal::AssertHelper::AssertHelper
                                          (local_4f8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1c9,(char *)gtest_ar._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (local_4f8,(Message *)&textReader);
                                goto LAB_001a9aaa;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(local_4e8);
                              pvVar8 = opentracing::v3::
                                       expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                       ::operator->((
                                                  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                  *)&gtest_ar__5);
                              __old_p_3 = (pointer)(pvVar8->_M_t).
                                                                                                      
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl;
                              (pvVar8->_M_t).
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (SpanContext *)0x0;
                              if (pSVar10 != (SpanContext *)0x0) {
                                (*(pSVar10->super_SpanContext)._vptr_SpanContext[1])();
                              }
                              local_4e8[0].ptr_ =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                              fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ =
                                   __old_p_3 != (SpanContext *)0x0;
                              if (__old_p_3 == (SpanContext *)0x0) {
                                testing::Message::Message((Message *)&textReader);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&gtest_ar,(char *)&fakeCtx,
                                           "static_cast<bool>(extractedCtx)","false");
                                testing::internal::AssertHelper::AssertHelper
                                          (local_4f8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1cb,(char *)gtest_ar._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (local_4f8,(Message *)&textReader);
                                testing::internal::AssertHelper::~AssertHelper(local_4f8);
                                std::__cxx11::string::~string((string *)&gtest_ar);
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&textReader);
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr(local_4e8);
                                __old_p_3 = (SpanContext *)0x0;
                                goto LAB_001a9c42;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(local_4e8);
                              textReader.super_TextMapReader._vptr_TextMapReader._0_4_ = 3;
                              fakeCtx.super_SpanContext._vptr_SpanContext =
                                   (SpanContext)(__old_p_3->_baggage)._M_h._M_element_count;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)&gtest_ar,"3","extractedCtx->baggage().size()",
                                         (int *)&textReader,(unsigned_long *)&fakeCtx);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&fakeCtx);
                                if (gtest_ar.message_.ptr_ !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  local_2b8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&textReader,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1cc,local_2b8);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                                goto LAB_001a9c1e;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                        ((internal *)&gtest_ar,"ctx","*extractedCtx",
                                         (SpanContext *)&result,__old_p_3);
                              cVar14 = gtest_ar.success_;
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&fakeCtx);
                                if (gtest_ar.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar18 = "";
                                }
                                else {
                                  pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&textReader,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1cd,pcVar18);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&textReader);
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&fakeCtx);
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              goto LAB_001a9b2a;
                            }
                            std::__cxx11::string::substr
                                      ((ulong)&gtest_ar,
                                       (ulong)&(__it._M_cur)->
                                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      );
                            bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,"uberctx-");
                            std::__cxx11::string::~string((string *)&gtest_ar);
                            if (!bVar6) break;
                            __it._M_cur = (__node_type *)
                                          std::
                                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                          ::erase((
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  *)&gtest_ar__1,__it._M_cur);
                          }
                        } while( true );
                      }
                      testing::Message::Message((Message *)&fakeCtx);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar18 = "";
                      }
                      else {
                        pcVar18 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&textReader,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                 ,0x1b4,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                      goto LAB_001a9aff;
                    }
                    testing::Message::Message((Message *)&textReader);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&gtest_ar,(char *)&fakeCtx,"static_cast<bool>(result)","false");
                    testing::internal::AssertHelper::AssertHelper
                              (local_4f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                               ,0x1b2,(char *)gtest_ar._0_8_);
                    testing::internal::AssertHelper::operator=(local_4f8,(Message *)&textReader);
                    testing::internal::AssertHelper::~AssertHelper(local_4f8);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&textReader);
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(psVar16);
LAB_001a9c42:
                  cVar14 = '\0';
                }
LAB_001a9b2a:
                SpanContext::~SpanContext((SpanContext *)&result);
                if (__old_p_3 != (SpanContext *)0x0) goto LAB_001a98c6;
                goto LAB_001a98d0;
              }
              testing::Message::Message((Message *)&fakeCtx);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&gtest_ar,&result.has_value_,"static_cast<bool>(extractedCtx)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&textReader,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x19b,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&textReader,(Message *)&fakeCtx);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
              std::__cxx11::string::~string((string *)&gtest_ar);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&fakeCtx);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&result.contained.m_value);
            opentracing::v3::
            expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
            ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                         *)&gtest_ar__5);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        }
        this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&gtest_ar__1;
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_00);
    }
  }
LAB_001a86a5:
  (**(code **)(*(long *)uVar5 + 8))(uVar5);
LAB_001a86ae:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handle.
              super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(Tracer, testPropagation)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    const std::unique_ptr<Span> span(static_cast<Span*>(
        tracer->StartSpanWithOptions("test-inject", {}).release()));
    span->SetBaggageItem("test-baggage-item-key", "test baggage item value");

    // Binary
    {
        std::stringstream ss;
        ASSERT_TRUE(static_cast<bool>(tracer->Inject(span->context(), ss)));
        auto result = tracer->Extract(ss);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
        FakeSpanContext fakeCtx;
        ss.clear();
        ss.str("");
        ASSERT_FALSE(static_cast<bool>(tracer->Inject(fakeCtx, ss)));
    }

    // Text map
    {
        StrMap textMap;
        WriterMock<opentracing::TextMapWriter> textWriter(textMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), textWriter)));
        ASSERT_EQ(2, textMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), textMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test baggage item value",
                  textMap.at(std::string(kTraceBaggageHeaderPrefix) +
                             "test-baggage-item-key"));
        ReaderMock<opentracing::TextMapReader> textReader(textMap);
        auto result = tracer->Extract(textReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
    }

    // HTTP map
    {
        StrMap headerMap;
        WriterMock<opentracing::HTTPHeadersWriter> headerWriter(headerMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), headerWriter)));
        ASSERT_EQ(2, headerMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), headerMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test%20baggage%20item%20value",
                  headerMap.at(std::string(kTraceBaggageHeaderPrefix) +
                               "test-baggage-item-key"));
        ReaderMock<opentracing::HTTPHeadersReader> headerReader(headerMap);
        auto result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);

        // Test debug header.
        headerMap.clear();
        headerMap[kJaegerDebugHeader] = "yes";
        tracer->Inject(span->context(), headerWriter);
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_NE(span->context(), *extractedCtx);
        SpanContext ctx(
            span->context().traceID(),
            span->context().spanID(),
            span->context().parentID(),
            span->context().flags() |
                static_cast<unsigned char>(SpanContext::Flag::kDebug),
            span->context().baggage(),
            "yes");
        ASSERT_EQ(ctx, *extractedCtx);

        // Test bad trace context.
        headerMap.clear();
        headerMap[kTraceContextHeaderName] = "12345678";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test empty map.
        headerMap.clear();
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test alternative baggage format.
        headerMap.clear();
        ctx = SpanContext(span->context().traceID(),
                          span->context().spanID(),
                          span->context().parentID(),
                          span->context().flags(),
                          { { "a", "x" }, { "b", "y" }, { "c", "z" } });
        tracer->Inject(ctx, headerWriter);
        for (auto itr = std::begin(headerMap); itr != std::end(headerMap);) {
            if (itr->first.substr(0, std::strlen(kTraceBaggageHeaderPrefix)) ==
                kTraceBaggageHeaderPrefix) {
                itr = headerMap.erase(itr);
            }
            else {
                ++itr;
            }
        }
        headerMap[kJaegerBaggageHeader] = "a=x,b=y,c=z";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(3, extractedCtx->baggage().size());
        ASSERT_EQ(ctx, *extractedCtx);
    }
    tracer->Close();
}